

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall AbstractTransaction_TxArray_Test::TestBody(AbstractTransaction_TxArray_Test *this)

{
  bool bVar1;
  AssertHelper local_68;
  Message local_60 [2];
  value_type local_50 [3];
  undefined1 local_38 [8];
  TestTransaction tx;
  vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
  vector_info;
  AbstractTransaction_TxArray_Test *this_local;
  
  std::vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>::
  vector((vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
          *)&tx.super_AbstractTransaction.wally_tx_pointer_);
  TestTransaction::TestTransaction((TestTransaction *)local_38);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_50[0] = (value_type)local_38;
      std::
      vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>::
      push_back((vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
                 *)&tx.super_AbstractTransaction.wally_tx_pointer_,local_50);
    }
  }
  else {
    testing::Message::Message(local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x145,
               "Expected: (vector_info.push_back(&tx)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  TestTransaction::~TestTransaction((TestTransaction *)local_38);
  std::vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>::
  ~vector((vector<cfd::core::AbstractTransaction_*,_std::allocator<cfd::core::AbstractTransaction_*>_>
           *)&tx.super_AbstractTransaction.wally_tx_pointer_);
  return;
}

Assistant:

TEST(AbstractTransaction, TxArray) {
  std::vector<AbstractTransaction*> vector_info;
  TestTransaction tx;
  EXPECT_NO_THROW((vector_info.push_back(&tx)));
}